

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void __thiscall FMapInfoParser::ParseOpenBrace(FMapInfoParser *this)

{
  bool bVar1;
  
  if (this->format_type == 1) {
    return;
  }
  if (this->format_type == 2) {
    FScanner::MustGetStringName(&this->sc,"{");
  }
  else {
    bVar1 = FScanner::CheckString(&this->sc,"{");
    this->format_type = bVar1 + 1;
    if (!bVar1) {
      return;
    }
  }
  FScanner::SetCMode(&this->sc,true);
  return;
}

Assistant:

void FMapInfoParser::ParseOpenBrace()
{
	switch(format_type)
	{
	default:
		format_type = sc.CheckString("{") ? FMT_New : FMT_Old;
		if (format_type == FMT_New) 
			sc.SetCMode(true);
		break;

	case FMT_Old:
		break;

	case FMT_New:
		sc.MustGetStringName("{");
		sc.SetCMode(true);
		break;
	}
}